

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

bool __thiscall
perfetto::protos::gen::NotifyDataSourceStartedRequest::operator==
          (NotifyDataSourceStartedRequest *this,NotifyDataSourceStartedRequest *other)

{
  __type_conflict4 _Var1;
  bool local_19;
  NotifyDataSourceStartedRequest *other_local;
  NotifyDataSourceStartedRequest *this_local;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  local_19 = false;
  if (_Var1) {
    local_19 = this->data_source_id_ == other->data_source_id_;
  }
  return local_19;
}

Assistant:

bool NotifyDataSourceStartedRequest::operator==(const NotifyDataSourceStartedRequest& other) const {
  return unknown_fields_ == other.unknown_fields_
   && data_source_id_ == other.data_source_id_;
}